

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O2

Array<kj::String> * __thiscall
kj::anon_unknown_8::DiskHandle::listNames
          (Array<kj::String> *__return_storage_ptr__,DiskHandle *this)

{
  Array<kj::String> *pAVar1;
  bool bVar2;
  int iVar3;
  int osErrorNumber;
  __off_t _Var4;
  DIR *__dirp;
  int *piVar5;
  dirent *pdVar6;
  size_t sVar7;
  size_t in_RCX;
  StringPtr value;
  StringPtr value_00;
  StringPtr name;
  Vector<kj::String> entries;
  DIR *dir;
  Fault f_3;
  Deferred<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_filesystem_disk_unix_c__:662:5)>
  _kjDefer662;
  StringPtr local_b8;
  ArrayBuilder<kj::String> local_a8;
  DIR *local_88;
  Array<char> local_80;
  Array<kj::String> *local_68;
  Deferred<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_filesystem_disk_unix_c__:662:5)>
  local_60;
  StringPtr local_50;
  StringPtr local_40;
  
  do {
    _Var4 = lseek((this->fd).fd,0,0);
    if (-1 < _Var4) goto LAB_004c1957;
    iVar3 = kj::_::Debug::getOsErrorNumber(false);
  } while (iVar3 == -1);
  if (iVar3 != 0) {
    kj::_::Debug::Fault::Fault
              ((Fault *)&local_a8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
               ,0x28a,iVar3,"lseek(fd, 0, SEEK_SET)","");
    kj::_::Debug::Fault::fatal((Fault *)&local_a8);
  }
LAB_004c1957:
  do {
    iVar3 = dup((this->fd).fd);
    if (-1 < iVar3) goto LAB_004c1978;
    osErrorNumber = kj::_::Debug::getOsErrorNumber(false);
  } while (osErrorNumber == -1);
  if (osErrorNumber != 0) {
    kj::_::Debug::Fault::Fault
              ((Fault *)&local_a8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
               ,0x28f,osErrorNumber,"duped = dup(fd)","");
    kj::_::Debug::Fault::fatal((Fault *)&local_a8);
  }
LAB_004c1978:
  local_68 = __return_storage_ptr__;
  __dirp = fdopendir(iVar3);
  local_88 = __dirp;
  if (__dirp == (DIR *)0x0) {
    close(iVar3);
    piVar5 = __errno_location();
    kj::_::Debug::Fault::Fault
              ((Fault *)&local_a8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
               ,0x293,*piVar5,"fdopendir","");
    kj::_::Debug::Fault::fatal((Fault *)&local_a8);
  }
  local_60.func.dir = (DIR **)&local_88;
  local_60.canceled = false;
  local_a8.ptr = (String *)0x0;
  local_a8.pos = (RemoveConst<kj::String> *)0x0;
  local_a8.endPtr = (String *)0x0;
  piVar5 = __errno_location();
  while( true ) {
    *piVar5 = 0;
    pdVar6 = readdir(__dirp);
    pAVar1 = local_68;
    if (pdVar6 == (dirent *)0x0) break;
    sVar7 = strlen(pdVar6->d_name);
    local_b8.content.size_ = sVar7 + 1;
    local_80.ptr = ".";
    local_80.size_ = 2;
    local_b8.content.ptr = pdVar6->d_name;
    bVar2 = StringPtr::operator!=(&local_b8,(StringPtr *)&local_80);
    __dirp = local_88;
    if (bVar2) {
      local_40.content.ptr = "..";
      local_40.content.size_ = 3;
      bVar2 = StringPtr::operator!=(&local_b8,&local_40);
      __dirp = local_88;
      if (bVar2) {
        local_50.content.ptr = ".kj-tmp.";
        local_50.content.size_ = 9;
        bVar2 = StringPtr::startsWith(&local_b8,&local_50);
        __dirp = local_88;
        if (!bVar2) {
          if (pdVar6->d_type == '\0') {
            value_00.content.size_ = in_RCX;
            value_00.content.ptr = (char *)local_b8.content.size_;
            heapString((String *)&local_80,(kj *)local_b8.content.ptr,value_00);
            Vector<kj::String>::add<kj::String>((Vector<kj::String> *)&local_a8,(String *)&local_80)
            ;
          }
          else {
            value.content.size_ = in_RCX;
            value.content.ptr = (char *)local_b8.content.size_;
            heapString((String *)&local_80,(kj *)local_b8.content.ptr,value);
            Vector<kj::String>::add<kj::String>((Vector<kj::String> *)&local_a8,(String *)&local_80)
            ;
          }
          Array<char>::~Array(&local_80);
          __dirp = local_88;
        }
      }
    }
  }
  if (*piVar5 != 0) {
    kj::_::Debug::Fault::Fault
              ((Fault *)&local_80,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
               ,0x2a2,*piVar5,"readdir","");
    kj::_::Debug::Fault::fatal((Fault *)&local_80);
  }
  Vector<kj::String>::releaseAsArray(local_68,(Vector<kj::String> *)&local_a8);
  std::__sort<kj::String*,__gnu_cxx::__ops::_Iter_less_iter>
            (pAVar1->ptr,pAVar1->ptr + pAVar1->size_);
  ArrayBuilder<kj::String>::dispose(&local_a8);
  kj::_::
  Deferred<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++:662:5)>
  ::~Deferred(&local_60);
  return pAVar1;
}

Assistant:

Array<String> listNames() const {
    return list(false, [](StringPtr name, FsNode::Type type) { return heapString(name); });
  }